

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_null<toml::type_config>(location *loc,context<toml::type_config> *ctx)

{
  bool bVar1;
  context<toml::type_config> *in_RDX;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_RDI;
  region reg;
  spec *spec;
  spec *in_stack_fffffffffffff9b8;
  region *s;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_stack_fffffffffffff9c0;
  location *plVar2;
  location *this;
  allocator<char> *in_stack_fffffffffffff9f0;
  allocator<char> *__a;
  char *in_stack_fffffffffffff9f8;
  allocator<char> *__s;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffa18;
  location *in_stack_fffffffffffffa28;
  undefined8 in_stack_fffffffffffffa30;
  undefined8 in_stack_fffffffffffffa38;
  source_location *in_stack_fffffffffffffa40;
  undefined8 in_stack_fffffffffffffaa8;
  string *in_stack_fffffffffffffb78;
  source_location *in_stack_fffffffffffffb80;
  string *in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc14;
  location *in_stack_fffffffffffffc18;
  literal *in_stack_fffffffffffffc20;
  string *in_stack_fffffffffffffc28;
  location local_361 [2];
  location local_290;
  allocator<char> local_209 [280];
  allocator<char> local_f1 [209];
  spec *local_20;
  
  this_00 = in_RDI;
  local_20 = context<toml::type_config>::toml_spec(in_RDX);
  if ((local_20->ext_null_value & 1U) == 0) {
    __s = local_f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (char *)__s,in_stack_fffffffffffff9f0);
    region::region((region *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
    source_location::source_location(in_stack_fffffffffffffa40,(region *)in_stack_fffffffffffffa38);
    __a = local_209;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (char *)__s,__a);
    make_error_info<>(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,in_stack_fffffffffffffb78)
    ;
    err<toml::error_info>((error_info *)in_stack_fffffffffffffa18._M_pi);
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (in_stack_fffffffffffff9c0,(failure_type *)in_stack_fffffffffffff9b8);
    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x72e21a);
    error_info::~error_info((error_info *)in_stack_fffffffffffff9c0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff9c0);
    std::allocator<char>::~allocator((allocator<char> *)local_209);
    source_location::~source_location((source_location *)in_stack_fffffffffffff9c0);
    region::~region((region *)in_stack_fffffffffffff9c0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff9c0);
    std::allocator<char>::~allocator(local_f1);
  }
  else {
    this = &local_290;
    syntax::null_value(in_stack_fffffffffffff9b8);
    literal::scan((literal *)in_stack_fffffffffffffa38,(location *)in_stack_fffffffffffffa30);
    literal::~literal((literal *)0x72e3b5);
    bVar1 = region::is_ok((region *)0x72e3c2);
    if (bVar1) {
      s = (region *)&stack0xfffffffffffffa10;
      region::region((region *)in_stack_fffffffffffff9c0,s);
      in_stack_fffffffffffff9c0 =
           (result<toml::basic_value<toml::type_config>,_toml::error_info> *)
           &stack0xfffffffffffffa80;
      basic_value<toml::type_config>::basic_value
                ((basic_value<toml::type_config> *)in_stack_fffffffffffff9c0,s);
      ok<toml::basic_value<toml::type_config>>
                ((basic_value<toml::type_config> *)in_stack_fffffffffffffaa8);
      result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                (in_stack_fffffffffffff9c0,(success_type *)s);
      success<toml::basic_value<toml::type_config>_>::~success
                ((success<toml::basic_value<toml::type_config>_> *)0x72e6a3);
      basic_value<toml::type_config>::~basic_value
                ((basic_value<toml::type_config> *)in_stack_fffffffffffff9c0);
      region::~region((region *)in_stack_fffffffffffff9c0);
    }
    else {
      plVar2 = local_361;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
      syntax::null_value(in_stack_fffffffffffff9b8);
      location::location(this,plVar2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
      make_syntax_error<toml::detail::literal>
                (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                 (string *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
      err<toml::error_info>((error_info *)in_stack_fffffffffffffa18._M_pi);
      result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                (in_stack_fffffffffffff9c0,(failure_type *)in_stack_fffffffffffff9b8);
      failure<toml::error_info>::~failure((failure<toml::error_info> *)0x72e4b9);
      error_info::~error_info((error_info *)in_stack_fffffffffffff9c0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9c0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc17);
      location::~location((location *)in_stack_fffffffffffff9c0);
      literal::~literal((literal *)0x72e4fa);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9c0);
      std::allocator<char>::~allocator((allocator<char> *)local_361);
    }
    region::~region((region *)in_stack_fffffffffffff9c0);
  }
  return in_RDI;
}

Assistant:

result<basic_value<TC>, error_info>
parse_null(location& loc, const context<TC>& ctx)
{
    const auto& spec = ctx.toml_spec();
    if( ! spec.ext_null_value)
    {
        return err(make_error_info("toml::parse_null: "
            "invalid spec: spec.ext_null_value must be true.",
            source_location(region(loc)), "here"));
    }

    // ----------------------------------------------------------------------
    // check syntax
    auto reg = syntax::null_value(spec).scan(loc);
    if( ! reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_null: "
            "invalid null: null must be lowercase. ",
            syntax::null_value(spec), loc));
    }

    // ----------------------------------------------------------------------
    // it matches. gen value

    // ----------------------------------------------------------------------
    // no format info for boolean

    return ok(basic_value<TC>(detail::none_t{}, std::move(reg)));
}